

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O0

UObject * __thiscall
icu_63::CFactory::create(CFactory *this,ICUServiceKey *key,ICUService *param_2,UErrorCode *status)

{
  int iVar1;
  undefined4 extraout_var;
  undefined1 local_118 [8];
  Locale validLoc;
  LocaleKey *lkey;
  UErrorCode *status_local;
  ICUService *param_2_local;
  ICUServiceKey *key_local;
  CFactory *this_local;
  
  iVar1 = (*(this->super_LocaleKeyFactory).super_ICUServiceFactory.super_UObject._vptr_UObject[6])
                    (this,key,status);
  if ((char)iVar1 == '\0') {
    this_local = (CFactory *)0x0;
  }
  else {
    validLoc._216_8_ = key;
    Locale::Locale((Locale *)local_118);
    (**(code **)(*(long *)validLoc._216_8_ + 0x60))(validLoc._216_8_,(Locale *)local_118);
    iVar1 = (*(this->_delegate->super_UObject)._vptr_UObject[4])(this->_delegate,local_118);
    this_local = (CFactory *)CONCAT44(extraout_var,iVar1);
    Locale::~Locale((Locale *)local_118);
  }
  return (UObject *)this_local;
}

Assistant:

UObject* 
CFactory::create(const ICUServiceKey& key, const ICUService* /* service */, UErrorCode& status) const
{
    if (handlesKey(key, status)) {
        const LocaleKey& lkey = (const LocaleKey&)key;
        Locale validLoc;
        lkey.currentLocale(validLoc);
        return _delegate->createCollator(validLoc);
    }
    return NULL;
}